

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_auth_digest_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  size_t local_48;
  size_t len;
  char *rplyb64;
  char *chlg64;
  SessionHandle *data;
  smtpstate local_20;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  chlg64 = (char *)conn->data;
  rplyb64 = (char *)0x0;
  len = 0;
  local_48 = 0;
  local_20 = instate;
  result = smtpcode;
  _instate_local = conn;
  if (smtpcode == 0x14e) {
    smtp_get_message((((SessionHandle *)chlg64)->state).buffer,&rplyb64);
    data._4_4_ = Curl_sasl_create_digest_md5_message
                           ((SessionHandle *)chlg64,rplyb64,_instate_local->user,
                            _instate_local->passwd,"smtp",(char **)&len,&local_48);
    if (data._4_4_ == CURLE_OK) {
      data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",len);
      if (data._4_4_ == CURLE_OK) {
        state(_instate_local,SMTP_AUTH_DIGESTMD5_RESP);
      }
    }
    else if ((data._4_4_ == CURLE_BAD_CONTENT_ENCODING) &&
            (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s","*"),
            data._4_4_ == CURLE_OK)) {
      state(_instate_local,SMTP_AUTH_CANCEL);
    }
    if (len != 0) {
      (*Curl_cfree)((void *)len);
    }
    conn_local._4_4_ = data._4_4_;
  }
  else {
    Curl_failf((SessionHandle *)chlg64,"Access denied: %d",(ulong)(uint)smtpcode);
    conn_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_state_auth_digest_resp(struct connectdata *conn,
                                            int smtpcode,
                                            smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *chlg64 = NULL;
  char *rplyb64 = NULL;
  size_t len = 0;

  (void)instate; /* no use for this yet */

  if(smtpcode != 334) {
    failf(data, "Access denied: %d", smtpcode);
    return CURLE_LOGIN_DENIED;
  }

  /* Get the challenge message */
  smtp_get_message(data->state.buffer, &chlg64);

  /* Create the response message */
  result = Curl_sasl_create_digest_md5_message(data, chlg64,
                                               conn->user, conn->passwd,
                                               "smtp", &rplyb64, &len);
  if(result) {
    if(result == CURLE_BAD_CONTENT_ENCODING) {
      /* Send the cancellation */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s", "*");

      if(!result)
        state(conn, SMTP_AUTH_CANCEL);
    }
  }
  else {
    /* Send the response */
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s", rplyb64);

    if(!result)
      state(conn, SMTP_AUTH_DIGESTMD5_RESP);
  }

  Curl_safefree(rplyb64);

  return result;
}